

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall unitStrings_charge_Test::TestBody(unitStrings_charge_Test *this)

{
  bool bVar1;
  precise_unit *ppVar2;
  char *pcVar3;
  uint64_t in_RCX;
  string *psVar4;
  string *psVar5;
  AssertHelper local_480;
  Message local_478;
  precise_unit local_470;
  precise_unit local_460;
  string local_450;
  undefined1 local_430 [8];
  AssertionResult gtest_ar_11;
  Message local_418;
  precise_unit local_410;
  precise_unit local_400;
  string local_3f0;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_10;
  Message local_3b8;
  precise_unit local_3b0;
  precise_unit local_3a0;
  string local_390;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_9;
  Message local_358;
  precise_unit local_350;
  precise_unit local_340;
  string local_330;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_8;
  Message local_2f8;
  precise_unit local_2f0;
  precise_unit local_2e0;
  string local_2d0;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_7;
  Message local_298;
  precise_unit local_290;
  precise_unit local_280;
  string local_270;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_6;
  Message local_238;
  precise_unit local_230;
  precise_unit local_220;
  string local_210;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_5;
  Message local_1d8;
  precise_unit local_1d0;
  precise_unit local_1c0;
  string local_1b0;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_4;
  Message local_178;
  precise_unit local_170;
  precise_unit local_160;
  string local_150;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_3;
  Message local_118;
  precise_unit local_110;
  precise_unit local_100;
  string local_f0;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  Message local_b8;
  precise_unit local_b0;
  string local_a0;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68 [3];
  precise_unit local_50;
  string local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  unitStrings_charge_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_50 = units::precise_unit::operator*
                       ((precise_unit *)units::precise::A,(precise_unit *)units::precise::s);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar4 = &local_40;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_50,ppVar2,in_RCX);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[2],_nullptr>
            ((EqHelper *)local_20,"to_string(precise::A * precise::s)","\"C\"",psVar4,
             (char (*) [2])0x282eec);
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    psVar4 = (string *)0x177;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x177,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_b0 = units::precise_unit::operator*
                       ((precise_unit *)units::precise::A,(precise_unit *)units::precise::hr);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar5 = &local_a0;
  units::to_string_abi_cxx11_(psVar5,(units *)&local_b0,ppVar2,(uint64_t)psVar4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_80,"to_string(precise::A * precise::hr)","\"Ah\"",psVar5,
             (char (*) [3])0x27ef68);
  std::__cxx11::string::~string((string *)&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    psVar5 = (string *)0x179;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x179,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_110 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::femto,(precise_unit *)units::precise::A);
  local_100 = units::precise_unit::operator*(&local_110,(precise_unit *)units::precise::hr);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar4 = &local_f0;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_100,ppVar2,(uint64_t)psVar5);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_d0,"to_string(precise::femto * precise::A * precise::hr)","\"fAh\"",
             psVar4,(char (*) [4])"fAh");
  std::__cxx11::string::~string((string *)&local_f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    psVar4 = (string *)0x17a;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x17a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  local_170 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::quecto,(precise_unit *)units::precise::A);
  local_160 = units::precise_unit::operator*(&local_170,(precise_unit *)units::precise::hr);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar5 = &local_150;
  units::to_string_abi_cxx11_(psVar5,(units *)&local_160,ppVar2,(uint64_t)psVar4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_130,"to_string(precise::quecto * precise::A * precise::hr)","\"qAh\""
             ,psVar5,(char (*) [4])"qAh");
  std::__cxx11::string::~string((string *)&local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    psVar5 = (string *)0x17b;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x17b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  local_1d0 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::pico,(precise_unit *)units::precise::A);
  local_1c0 = units::precise_unit::operator*(&local_1d0,(precise_unit *)units::precise::hr);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar4 = &local_1b0;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_1c0,ppVar2,(uint64_t)psVar5);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_190,"to_string(precise::pico * precise::A * precise::hr)","\"pAh\"",
             psVar4,(char (*) [4])"pAh");
  std::__cxx11::string::~string((string *)&local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    psVar4 = (string *)0x17c;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x17c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  local_230 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::nano,(precise_unit *)units::precise::A);
  local_220 = units::precise_unit::operator*(&local_230,(precise_unit *)units::precise::hr);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar5 = &local_210;
  units::to_string_abi_cxx11_(psVar5,(units *)&local_220,ppVar2,(uint64_t)psVar4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_1f0,"to_string(precise::nano * precise::A * precise::hr)","\"nAh\"",
             psVar5,(char (*) [4])"nAh");
  std::__cxx11::string::~string((string *)&local_210);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    psVar5 = (string *)0x17d;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x17d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  local_290 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::micro,(precise_unit *)units::precise::A);
  local_280 = units::precise_unit::operator*(&local_290,(precise_unit *)units::precise::hr);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar4 = &local_270;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_280,ppVar2,(uint64_t)psVar5);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_250,"to_string(precise::micro * precise::A * precise::hr)","\"uAh\"",
             psVar4,(char (*) [4])"uAh");
  std::__cxx11::string::~string((string *)&local_270);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    psVar4 = (string *)0x17e;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x17e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  local_2f0 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::milli,(precise_unit *)units::precise::A);
  local_2e0 = units::precise_unit::operator*(&local_2f0,(precise_unit *)units::precise::hr);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar5 = &local_2d0;
  units::to_string_abi_cxx11_(psVar5,(units *)&local_2e0,ppVar2,(uint64_t)psVar4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_2b0,"to_string(precise::milli * precise::A * precise::hr)","\"mAh\"",
             psVar5,(char (*) [4])"mAh");
  std::__cxx11::string::~string((string *)&local_2d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    psVar5 = (string *)0x17f;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x17f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  local_350 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::kilo,(precise_unit *)units::precise::A);
  local_340 = units::precise_unit::operator*(&local_350,(precise_unit *)units::precise::hr);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar4 = &local_330;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_340,ppVar2,(uint64_t)psVar5);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_310,"to_string(precise::kilo * precise::A * precise::hr)","\"kAh\"",
             psVar4,(char (*) [4])"kAh");
  std::__cxx11::string::~string((string *)&local_330);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    psVar4 = (string *)0x180;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x180,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  local_3b0 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::mega,(precise_unit *)units::precise::A);
  local_3a0 = units::precise_unit::operator*(&local_3b0,(precise_unit *)units::precise::hr);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar5 = &local_390;
  units::to_string_abi_cxx11_(psVar5,(units *)&local_3a0,ppVar2,(uint64_t)psVar4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_370,"to_string(precise::mega * precise::A * precise::hr)","\"MAh\"",
             psVar5,(char (*) [4])"MAh");
  std::__cxx11::string::~string((string *)&local_390);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_3b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    psVar5 = (string *)0x181;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x181,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  local_410 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::giga,(precise_unit *)units::precise::A);
  local_400 = units::precise_unit::operator*(&local_410,(precise_unit *)units::precise::hr);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar4 = &local_3f0;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_400,ppVar2,(uint64_t)psVar5);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_3d0,"to_string(precise::giga * precise::A * precise::hr)","\"GAh\"",
             psVar4,(char (*) [4])"GAh");
  std::__cxx11::string::~string((string *)&local_3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar1) {
    testing::Message::Message(&local_418);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3d0);
    psVar4 = (string *)0x182;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x182,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  local_470 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::tera,(precise_unit *)units::precise::A);
  local_460 = units::precise_unit::operator*(&local_470,(precise_unit *)units::precise::hr);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_450,(units *)&local_460,ppVar2,(uint64_t)psVar4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_430,"to_string(precise::tera * precise::A * precise::hr)","\"TAh\"",
             &local_450,(char (*) [4])"TAh");
  std::__cxx11::string::~string((string *)&local_450);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
  if (!bVar1) {
    testing::Message::Message(&local_478);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_430);
    testing::internal::AssertHelper::AssertHelper
              (&local_480,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x183,pcVar3);
    testing::internal::AssertHelper::operator=(&local_480,&local_478);
    testing::internal::AssertHelper::~AssertHelper(&local_480);
    testing::Message::~Message(&local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
  return;
}

Assistant:

TEST(unitStrings, charge)
{
    // A * s = C
    EXPECT_EQ(to_string(precise::A * precise::s), "C");
    // A * h = 3600 C, better use A * h
    EXPECT_EQ(to_string(precise::A * precise::hr), "Ah");
    EXPECT_EQ(to_string(precise::femto * precise::A * precise::hr), "fAh");
    EXPECT_EQ(to_string(precise::quecto * precise::A * precise::hr), "qAh");
    EXPECT_EQ(to_string(precise::pico * precise::A * precise::hr), "pAh");
    EXPECT_EQ(to_string(precise::nano * precise::A * precise::hr), "nAh");
    EXPECT_EQ(to_string(precise::micro * precise::A * precise::hr), "uAh");
    EXPECT_EQ(to_string(precise::milli * precise::A * precise::hr), "mAh");
    EXPECT_EQ(to_string(precise::kilo * precise::A * precise::hr), "kAh");
    EXPECT_EQ(to_string(precise::mega * precise::A * precise::hr), "MAh");
    EXPECT_EQ(to_string(precise::giga * precise::A * precise::hr), "GAh");
    EXPECT_EQ(to_string(precise::tera * precise::A * precise::hr), "TAh");
}